

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ReadNumber(SQLexer *this)

{
  int iVar1;
  SQInteger SVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger *res;
  char *pcVar4;
  SQUnsignedInteger in_RDI;
  double dVar5;
  SQChar *sTemp;
  SQInteger firstchar;
  SQInteger type;
  char *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd1;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  undefined1 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd5;
  undefined1 in_stack_ffffffffffffffd6;
  char *local_28;
  ulong local_20;
  long local_18;
  SQInteger local_8;
  
  local_18 = 1;
  local_20 = (ulong)*(byte *)(in_RDI + 0x60);
  sqvector<char>::resize
            ((sqvector<char> *)
             (ulong)CONCAT16(in_stack_ffffffffffffffd6,
                             CONCAT15(in_stack_ffffffffffffffd5,
                                      CONCAT14(in_stack_ffffffffffffffd4,
                                               CONCAT13(in_stack_ffffffffffffffd3,
                                                        CONCAT12(in_stack_ffffffffffffffd2,
                                                                 CONCAT11(in_stack_ffffffffffffffd1,
                                                                          in_stack_ffffffffffffffd0)
                                                                ))))),in_RDI,
             (char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  Next((SQLexer *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
  if ((local_20 == 0x30) &&
     ((iVar1 = toupper((uint)*(byte *)(in_RDI + 0x60)), iVar1 == 0x58 ||
      (SVar2 = scisodigit((ulong)*(byte *)(in_RDI + 0x60)), SVar2 != 0)))) {
    SVar2 = scisodigit((ulong)*(byte *)(in_RDI + 0x60));
    if (SVar2 == 0) {
      Next((SQLexer *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
      local_18 = 3;
      while (iVar1 = isxdigit((uint)*(byte *)(in_RDI + 0x60)), iVar1 != 0) {
        sqvector<char>::push_back
                  ((sqvector<char> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        Next((SQLexer *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
        *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
      }
      SVar3 = sqvector<char>::size((sqvector<char> *)(in_RDI + 0x70));
      if (0x10 < SVar3) {
        Error((SQLexer *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8);
      }
    }
    else {
      local_18 = 5;
      while (SVar2 = scisodigit((ulong)*(byte *)(in_RDI + 0x60)), SVar2 != 0) {
        sqvector<char>::push_back
                  ((sqvector<char> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        Next((SQLexer *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
        *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
      }
      iVar1 = isdigit((uint)*(byte *)(in_RDI + 0x60));
      if (iVar1 != 0) {
        Error((SQLexer *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8);
      }
    }
  }
  else {
    sqvector<char>::push_back
              ((sqvector<char> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    while( true ) {
      uVar6 = true;
      if (*(char *)(in_RDI + 0x60) != '.') {
        iVar1 = isdigit((uint)*(byte *)(in_RDI + 0x60));
        uVar6 = true;
        if (iVar1 == 0) {
          SVar2 = isexponent((ulong)*(byte *)(in_RDI + 0x60));
          uVar6 = SVar2 != 0;
        }
      }
      if ((bool)uVar6 == false) break;
      if ((*(char *)(in_RDI + 0x60) == '.') ||
         (SVar2 = isexponent((ulong)*(byte *)(in_RDI + 0x60)), SVar2 != 0)) {
        local_18 = 2;
      }
      SVar2 = isexponent((ulong)*(byte *)(in_RDI + 0x60));
      if (SVar2 != 0) {
        if (local_18 != 2) {
          Error((SQLexer *)CONCAT17(uVar6,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
        }
        local_18 = 4;
        sqvector<char>::push_back
                  ((sqvector<char> *)CONCAT17(uVar6,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        Next((SQLexer *)CONCAT17(uVar6,in_stack_ffffffffffffffc0));
        *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
        if ((*(char *)(in_RDI + 0x60) == '+') || (*(char *)(in_RDI + 0x60) == '-')) {
          sqvector<char>::push_back
                    ((sqvector<char> *)CONCAT17(uVar6,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
          Next((SQLexer *)CONCAT17(uVar6,in_stack_ffffffffffffffc0));
          *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
        }
        iVar1 = isdigit((uint)*(byte *)(in_RDI + 0x60));
        if (iVar1 == 0) {
          Error((SQLexer *)CONCAT17(uVar6,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
        }
      }
      sqvector<char>::push_back
                ((sqvector<char> *)CONCAT17(uVar6,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      Next((SQLexer *)CONCAT17(uVar6,in_stack_ffffffffffffffc0));
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
    }
    in_stack_ffffffffffffffc7 = 0;
  }
  sqvector<char>::push_back
            ((sqvector<char> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  res = (SQUnsignedInteger *)(local_18 + -1);
  switch(res) {
  case (SQUnsignedInteger *)0x0:
    pcVar4 = sqvector<char>::operator[]((sqvector<char> *)(in_RDI + 0x70),0);
    LexInteger(pcVar4,(SQUnsignedInteger *)(in_RDI + 0x40));
    local_8 = 0x104;
    break;
  case (SQUnsignedInteger *)0x1:
  case (SQUnsignedInteger *)0x3:
    pcVar4 = sqvector<char>::operator[]((sqvector<char> *)(in_RDI + 0x70),0);
    dVar5 = strtod(pcVar4,&local_28);
    *(float *)(in_RDI + 0x48) = (float)dVar5;
    local_8 = 0x105;
    break;
  case (SQUnsignedInteger *)0x2:
    sqvector<char>::operator[]((sqvector<char> *)(in_RDI + 0x70),0);
    LexHexadecimal((SQChar *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),res);
    local_8 = 0x104;
    break;
  case (SQUnsignedInteger *)0x4:
    sqvector<char>::operator[]((sqvector<char> *)(in_RDI + 0x70),0);
    LexOctal((SQChar *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),res);
    local_8 = 0x104;
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQInteger SQLexer::ReadNumber()
{
#define TINT 1
#define TFLOAT 2
#define THEX 3
#define TSCIENTIFIC 4
#define TOCTAL 5
    SQInteger type = TINT, firstchar = CUR_CHAR;
    SQChar *sTemp;
    INIT_TEMP_STRING();
    NEXT();
    if(firstchar == _SC('0') && (toupper(CUR_CHAR) == _SC('X') || scisodigit(CUR_CHAR)) ) {
        if(scisodigit(CUR_CHAR)) {
            type = TOCTAL;
            while(scisodigit(CUR_CHAR)) {
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
            if(scisdigit(CUR_CHAR)) Error(_SC("invalid octal number"));
        }
        else {
            NEXT();
            type = THEX;
            while(isxdigit(CUR_CHAR)) {
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
            if(_longstr.size() > MAX_HEX_DIGITS) Error(_SC("too many digits for an Hex number"));
        }
    }
    else {
        APPEND_CHAR((int)firstchar);
        while (CUR_CHAR == _SC('.') || scisdigit(CUR_CHAR) || isexponent(CUR_CHAR)) {
            if(CUR_CHAR == _SC('.') || isexponent(CUR_CHAR)) type = TFLOAT;
            if(isexponent(CUR_CHAR)) {
                if(type != TFLOAT) Error(_SC("invalid numeric format"));
                type = TSCIENTIFIC;
                APPEND_CHAR(CUR_CHAR);
                NEXT();
                if(CUR_CHAR == '+' || CUR_CHAR == '-'){
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                }
                if(!scisdigit(CUR_CHAR)) Error(_SC("exponent expected"));
            }

            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
    }
    TERMINATE_BUFFER();
    switch(type) {
    case TSCIENTIFIC:
    case TFLOAT:
        _fvalue = (SQFloat)scstrtod(&_longstr[0],&sTemp);
        return TK_FLOAT;
    case TINT:
        LexInteger(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    case THEX:
        LexHexadecimal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    case TOCTAL:
        LexOctal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    }
    return 0;
}